

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O2

int XlearnCreateDataFromMat
              (real_t *data,index_t nrow,index_t ncol,real_t *label,index_t *field_map,
              DataHandle *out)

{
  real_t rVar1;
  ulong uVar2;
  __uniq_ptr_data<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>,_true,_true> this;
  ulong uVar3;
  int i;
  ulong uVar4;
  int i_2;
  long lVar5;
  int j;
  ulong uVar6;
  unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> uVar7;
  int i_1;
  undefined1 auVar8 [16];
  unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> source;
  
  uVar2 = (ulong)nrow;
  this.super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>._M_t.
  super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
  super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl =
       (__uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>)operator_new(0x68);
  xLearn::DMatrix::DMatrix
            ((DMatrix *)
             this.super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>._M_t
             .super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
             super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl);
  uVar3 = (ulong)ncol;
  source._M_t.super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>._M_t.
  super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
  super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl =
       (__uniq_ptr_data<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>,_true,_true>)
       (__uniq_ptr_data<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>,_true,_true>)
       this.super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>._M_t.
       super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
       super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl;
  if (label == (real_t *)0x0) {
    *(bool *)((long)this.
                    super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>
                    .super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl + 0x60) = false;
    lVar5 = 0;
    if (field_map == (index_t *)0x0) {
      for (uVar4 = 0;
          uVar7._M_t.super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
          _M_t.super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
          super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl =
               source._M_t.
               super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>._M_t.
               super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
               super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl, uVar4 != uVar2;
          uVar4 = uVar4 + 1) {
        xLearn::DMatrix::AddRow
                  ((DMatrix *)
                   source._M_t.
                   super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
                   super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl);
        auVar8 = ZEXT816(0) << 0x40;
        uVar6 = 0;
        while (uVar3 != uVar6) {
          rVar1 = data[(int)lVar5 + (index_t)uVar6];
          xLearn::DMatrix::AddNode
                    ((DMatrix *)
                     source._M_t.
                     super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>
                     .super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl,(index_t)uVar4,
                     (index_t)uVar6,rVar1,0);
          uVar6 = uVar6 + 1;
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)auVar8._0_4_),ZEXT416((uint)rVar1),
                                   ZEXT416((uint)rVar1));
        }
        lVar5 = lVar5 + uVar3;
        *(float *)(*(long *)((long)source._M_t.
                                   super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>
                                   .super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl +
                            0x48) + uVar4 * 4) = 1.0 / auVar8._0_4_;
      }
    }
    else {
      for (uVar4 = 0;
          uVar7._M_t.super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
          _M_t.super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
          super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl =
               source._M_t.
               super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>._M_t.
               super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
               super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl, uVar4 != uVar2;
          uVar4 = uVar4 + 1) {
        xLearn::DMatrix::AddRow
                  ((DMatrix *)
                   source._M_t.
                   super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
                   super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl);
        auVar8 = ZEXT816(0) << 0x40;
        uVar6 = 0;
        while (uVar3 != uVar6) {
          rVar1 = data[(int)lVar5 + (index_t)uVar6];
          xLearn::DMatrix::AddNode
                    ((DMatrix *)
                     source._M_t.
                     super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>
                     .super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl,(index_t)uVar4,
                     (index_t)uVar6,rVar1,field_map[uVar6]);
          uVar6 = uVar6 + 1;
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)auVar8._0_4_),ZEXT416((uint)rVar1),
                                   ZEXT416((uint)rVar1));
        }
        lVar5 = lVar5 + uVar3;
        *(float *)(*(long *)((long)source._M_t.
                                   super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>
                                   .super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl +
                            0x48) + uVar4 * 4) = 1.0 / auVar8._0_4_;
      }
    }
  }
  else {
    *(bool *)((long)this.
                    super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>
                    .super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl + 0x60) = true;
    lVar5 = 0;
    if (field_map == (index_t *)0x0) {
      for (uVar4 = 0;
          uVar7._M_t.super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
          _M_t.super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
          super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl =
               source._M_t.
               super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>._M_t.
               super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
               super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl, uVar4 != uVar2;
          uVar4 = uVar4 + 1) {
        xLearn::DMatrix::AddRow
                  ((DMatrix *)
                   source._M_t.
                   super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
                   super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl);
        auVar8 = ZEXT816(0) << 0x40;
        uVar6 = 0;
        *(real_t *)
         (*(long *)((long)source._M_t.
                          super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>
                          .super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl + 0x30) +
         uVar4 * 4) = label[uVar4];
        while (uVar3 != uVar6) {
          rVar1 = data[(int)lVar5 + (index_t)uVar6];
          xLearn::DMatrix::AddNode
                    ((DMatrix *)
                     source._M_t.
                     super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>
                     .super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl,(index_t)uVar4,
                     (index_t)uVar6,rVar1,0);
          uVar6 = uVar6 + 1;
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)auVar8._0_4_),ZEXT416((uint)rVar1),
                                   ZEXT416((uint)rVar1));
        }
        lVar5 = lVar5 + uVar3;
        *(float *)(*(long *)((long)source._M_t.
                                   super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>
                                   .super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl +
                            0x48) + uVar4 * 4) = 1.0 / auVar8._0_4_;
      }
    }
    else {
      for (uVar4 = 0;
          uVar7._M_t.super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
          _M_t.super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
          super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl =
               source._M_t.
               super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>._M_t.
               super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
               super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl, uVar4 != uVar2;
          uVar4 = uVar4 + 1) {
        xLearn::DMatrix::AddRow
                  ((DMatrix *)
                   source._M_t.
                   super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
                   super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl);
        auVar8 = ZEXT816(0) << 0x40;
        uVar6 = 0;
        *(real_t *)
         (*(long *)((long)source._M_t.
                          super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>
                          .super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl + 0x30) +
         uVar4 * 4) = label[uVar4];
        while (uVar3 != uVar6) {
          rVar1 = data[(int)lVar5 + (index_t)uVar6];
          xLearn::DMatrix::AddNode
                    ((DMatrix *)
                     source._M_t.
                     super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>
                     .super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl,(index_t)uVar4,
                     (index_t)uVar6,rVar1,field_map[uVar6]);
          uVar6 = uVar6 + 1;
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)auVar8._0_4_),ZEXT416((uint)rVar1),
                                   ZEXT416((uint)rVar1));
        }
        lVar5 = lVar5 + uVar3;
        *(float *)(*(long *)((long)source._M_t.
                                   super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>
                                   .super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl +
                            0x48) + uVar4 * 4) = 1.0 / auVar8._0_4_;
      }
    }
  }
  source._M_t.super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>._M_t.
  super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
  super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl =
       (__uniq_ptr_data<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>,_true,_true>)
       (__uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>)0x0;
  *out = (DataHandle)
         uVar7._M_t.super___uniq_ptr_impl<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>.
         _M_t.super__Tuple_impl<0UL,_xLearn::DMatrix_*,_std::default_delete<xLearn::DMatrix>_>.
         super__Head_base<0UL,_xLearn::DMatrix_*,_false>._M_head_impl;
  std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::~unique_ptr(&source);
  return 0;
}

Assistant:

XL_DLL int XlearnCreateDataFromMat(const real_t* data,
                                   index_t nrow,
                                   index_t ncol,
                                   const real_t* label,
                                   index_t* field_map,
                                   DataHandle* out) {
  API_BEGIN();
  std::unique_ptr<xLearn::DMatrix> source(new xLearn::DMatrix());	
  // if feature_map equal nullptr, we will not use field
  if (label == nullptr) {
    source->has_label = false;
    if (field_map == nullptr) {
      for (int i = 0; i < nrow; ++i) {	
        source->AddRow();
        real_t norm = 0.0;
        for (int j = 0; j < ncol; ++j) {
          real_t value = data[j+i*ncol];
          source->AddNode(i, j, value);
          norm += value*value;
        }
        norm = 1.0f / norm;
        source->norm[i] = norm;
      }
    } else {
      for (int i = 0; i < nrow; ++i) {	
        source->AddRow();
        real_t norm = 0.0;
        for (int j = 0; j < ncol; ++j) {
          real_t value = data[j+i*ncol];
          source->AddNode(i, j, value, field_map[j]);
          norm += value*value;
        }
        norm = 1.0f / norm;
        source->norm[i] = norm;
      }
    }
  } else {
    source->has_label = true;
    if (field_map == nullptr) {
      for (int i = 0; i < nrow; ++i) {
        source->AddRow();
        real_t norm = 0.0;
        source->Y[i] = label[i];
        for (int j = 0; j < ncol; ++j) {
          real_t value = data[j+i*ncol];
          source->AddNode(i, j, value);
          norm += value*value;
        }
        norm = 1.0f / norm;
        source->norm[i] = norm;
      }
    } else {
      for (int i = 0; i < nrow; ++i) {	
        source->AddRow();
        real_t norm = 0.0;
        source->Y[i] = label[i];
        for (int j = 0; j < ncol; ++j) {
          real_t value = data[j+i*ncol];
          source->AddNode(i, j, value, field_map[j]);
          norm += value*value;
        }
        norm = 1.0f / norm;
        source->norm[i] = norm;
      }
    }
  }
  *out = source.release();
  API_END();
}